

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::
async_receive_from<asio::mutable_buffers_1,ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512ul>::Impl>>
          (reactive_socket_service<asio::ip::udp> *this,implementation_type *impl,
          mutable_buffers_1 *buffers,endpoint_type *sender_endpoint,message_flags flags,
          SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl> *handler)

{
  SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl> *op;
  int protocol_type;
  undefined1 auStack_58 [4];
  int protocol;
  ptr p;
  bool is_continuation;
  SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl> *handler_local;
  message_flags flags_local;
  endpoint_type *sender_endpoint_local;
  mutable_buffers_1 *buffers_local;
  implementation_type *impl_local;
  reactive_socket_service<asio::ip::udp> *this_local;
  
  p.p._7_1_ = asio_handler_cont_helpers::
              is_continuation<ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512ul>::Impl>>
                        (handler);
  _auStack_58 = handler;
  p.h = (SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl> *)
        reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
        ::ptr::allocate(handler);
  p.v = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
         *)0x0;
  protocol_type = ip::udp::type(&impl->protocol_);
  op = p.h;
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
  ::reactive_socket_recvfrom_op
            ((reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
              *)p.h,(impl->super_base_implementation_type).socket_,protocol_type,buffers,
             sender_endpoint,flags,handler);
  p.v = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
         *)op;
  reactive_socket_service_base::start_op
            (&this->super_reactive_socket_service_base,&impl->super_base_implementation_type,
             (flags & 1U) * 2,(reactor_op *)op,(bool)(p.p._7_1_ & 1),true,false);
  p.v = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
         *)0x0;
  p.h = (SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl> *)0x0;
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
  ::ptr::~ptr((ptr *)auStack_58);
  return;
}

Assistant:

void async_receive_from(implementation_type& impl,
      const MutableBufferSequence& buffers, endpoint_type& sender_endpoint,
      socket_base::message_flags flags, Handler& handler)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_recvfrom_op<MutableBufferSequence,
        endpoint_type, Handler> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    int protocol = impl.protocol_.type();
    p.p = new (p.v) op(impl.socket_, protocol,
        buffers, sender_endpoint, flags, handler);

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_receive_from"));

    start_op(impl,
        (flags & socket_base::message_out_of_band)
          ? reactor::except_op : reactor::read_op,
        p.p, is_continuation, true, false);
    p.v = p.p = 0;
  }